

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadlocal-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase33::TestCase33(TestCase33 *this)

{
  TestCase33 *this_local;
  
  TestCase::TestCase(&this->super_TestCase,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/threadlocal-test.c++"
                     ,0x21,"legacy test: ThreadLocal/Basic");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_007cb978;
  return;
}

Assistant:

TEST(ThreadLocal, Basic) {
  // Verify that both started out null.
  uint* p = tls1;
  EXPECT_EQ(nullptr, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Set tls1, then verify that only tls1 changed, not tls2.
  uint i = 123;
  tls1 = &i;

  p = tls1;
  EXPECT_EQ(&i, p);
  p = tls2;
  EXPECT_EQ(nullptr, p);

  // Check that in another thread, tls1 starts null but can be changed.
  uint j = 456;
  bool threadDone = false;
  Thread([&]() {
    p = tls1;
    EXPECT_EQ(nullptr, p);
    tls1 = &j;

    p = tls1;
    EXPECT_EQ(&j, p);
    threadDone = true;
  });
  EXPECT_TRUE(threadDone);

  // tls1 didn't change in this thread.
  p = tls1;
  EXPECT_EQ(&i, p);
}